

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::get_objfile(CTcMake *this,textchar_t *dst,CTcMakeModule *mod)

{
  int iVar1;
  textchar_t *fullpathbuflen;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  iVar1 = CTcMakeStr::is_set((CTcMakeStr *)(in_RDI + 0x18));
  if (iVar1 == 0) {
    CTcMakeModule::get_object_name((CTcMakeModule *)0x20a086);
    lib_strcpy(in_RSI,in_RDX,in_RDI);
  }
  else {
    fullpathbuflen = CTcMakeStr::get((CTcMakeStr *)(in_RDI + 0x18));
    CTcMakeModule::get_object_name((CTcMakeModule *)0x20a052);
    os_get_root_name(in_RSI);
    os_build_full_path(in_RDI,(size_t)fullpathbuflen,in_RSI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CTcMake::get_objfile(textchar_t *dst, CTcMakeModule *mod)
{
    /*
     *   If an object path is specified, remove the path part of the module
     *   name and add the root filename to the object path, since the object
     *   path overrides the source file path.  Otherwise, use the name as
     *   given.  
     */
    if (objdir_.is_set())
        os_build_full_path(dst, OSFNMAX, objdir_.get(),
                           os_get_root_name((char *)mod->get_object_name()));
    else
        lib_strcpy(dst, OSFNMAX, mod->get_object_name());
}